

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.hpp
# Opt level: O2

void qclab::printMatrix2x2<qclab::dense::SquareMatrix<std::complex<double>>>
               (SquareMatrix<std::complex<double>_> *mat)

{
  complex<double> in_stack_00000000;
  
  if (mat->size_ == 2) {
    print<double>(in_stack_00000000);
    print<double>(in_stack_00000000);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    print<double>(in_stack_00000000);
    print<double>(in_stack_00000000);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    return;
  }
  __assert_fail("mat.rows() == 2",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/util.hpp"
                ,0x61,
                "void qclab::printMatrix2x2(const T &) [T = qclab::dense::SquareMatrix<std::complex<double>>]"
               );
}

Assistant:

void printMatrix2x2( const T& mat ) {
    assert( mat.rows() == 2 ) ;
    assert( mat.cols() == 2 ) ;
    print( mat(0,0) ) ; print( mat(0,1) ) ; std::cout << std::endl ;
    print( mat(1,0) ) ; print( mat(1,1) ) ; std::cout << std::endl ;
  }